

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

void __thiscall
mocker::detail::InterferenceGraph::build
          (InterferenceGraph *this,LineIter funcBeg,LineIter funcEnd,
          function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *pushWorklist,
          function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *updateAssociatedMove)

{
  element_type *peVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>_>_>
  *puVar2;
  __node_base *p_Var3;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *__ht;
  _Hash_node_base *p_Var4;
  NasmCfg *cfg_00;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *xs;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *xs_00;
  __node_base *p_Var5;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  shared_ptr<mocker::nasm::Mov> mov;
  shared_ptr<mocker::nasm::Inst> inst;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  defs;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  uses;
  mapped_type live;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
  liveOut;
  NasmCfg cfg;
  shared_ptr<mocker::nasm::Mov> local_1c8;
  shared_ptr<mocker::nasm::Inst> local_1b8;
  __node_base *local_1a8;
  __shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  undefined1 local_190 [40];
  _Hash_node_base *local_168;
  _Hash_node_base *local_160;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *local_158;
  shared_ptr<mocker::nasm::Addr> local_150;
  undefined1 local_140 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  shared_ptr<mocker::nasm::Addr> local_118;
  __shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> local_e8;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_190._24_8_ = pushWorklist;
  local_190._32_8_ = updateAssociatedMove;
  buildNasmCfg((NasmCfg *)&local_68,funcBeg,funcEnd);
  buildLiveOut_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
              *)&local_a0,(mocker *)&local_68,cfg_00);
  puVar2 = NasmCfg::getNodes_abi_cxx11_((NasmCfg *)&local_68);
  p_Var3 = &(puVar2->_M_h)._M_before_begin;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_a0);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      return;
    }
    local_1a8 = p_Var3;
    __ht = &std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&local_a0,(key_type *)(p_Var3 + 1))->_M_h;
    std::
    _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_Hashtable(&local_d8,__ht);
    local_168 = local_1a8[5]._M_nxt;
    p_Var4 = local_1a8[6]._M_nxt;
    while( true ) {
      if (p_Var4 == local_168) break;
      local_160 = p_Var4;
      std::__shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1a0,
                 (__shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2> *)
                 (p_Var4[1]._M_nxt + 6));
      if (local_1a0._M_ptr != (element_type *)0x0) {
        nasm::getDefinedRegs
                  ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)local_190,(shared_ptr<mocker::nasm::Inst> *)&local_1a0);
        nasm::getUsedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           *)local_140,(shared_ptr<mocker::nasm::Inst> *)&local_1a0);
        std::dynamic_pointer_cast<mocker::nasm::Mov,mocker::nasm::Inst>(&local_1b8);
        if ((element_type *)
            local_1b8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
LAB_0012c6bb:
          local_1c8.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_1c8.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_108,
                     (__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_1b8.
                            super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 0x18));
          std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>(&local_150);
          if (local_150.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_150.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount)
            ;
            goto LAB_0012c6bb;
          }
          std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_e8,
                     (__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_1b8.
                            super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 8));
          std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>(&local_118);
          peVar1 = local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_150.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
          if (peVar1 == (element_type *)0x0) goto LAB_0012c6bb;
          local_1c8.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_1b8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1c8.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = local_1b8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          local_1b8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_1b8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1b8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (local_1c8.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          subSet<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>
                    ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      *)&local_d8,
                     (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      *)local_140);
          std::function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)>::operator()
                    ((function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *)local_190._32_8_
                     ,&local_1c8);
          std::function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)>::operator()
                    ((function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *)local_190._24_8_
                     ,&local_1c8);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1c8.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        unionSet<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>
                  ((mocker *)&local_d8,
                   (unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)local_190,xs);
        local_158 = (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                    local_190._8_8_;
        for (p_Var6 = (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                      local_190._0_8_; p_Var5 = &local_d8._M_before_begin, p_Var6 != local_158;
            p_Var6 = p_Var6 + 1) {
          while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
            std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                       (local_140 + 0x18),
                       (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                       (p_Var5 + 1));
            std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_f8,p_Var6);
            addEdge(this,(Node *)(local_140 + 0x18),(Node *)&local_f8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
          }
        }
        subSet<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>
                  ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)&local_d8,
                   (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)local_190);
        unionSet<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>
                  ((mocker *)&local_d8,
                   (unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)local_140,xs_00);
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)local_140);
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)local_190);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
      p_Var4 = local_160[1]._M_nxt;
    }
    std::
    _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_d8);
    p_Var3 = local_1a8;
  } while( true );
}

Assistant:

void InterferenceGraph::build(
    LineIter funcBeg, LineIter funcEnd,
    const std::function<void(const MovInst &)> &pushWorklist,
    const std::function<void(const MovInst &)> &updateAssociatedMove) {
  auto cfg = buildNasmCfg(funcBeg, funcEnd);
  auto liveOut = buildLiveOut(cfg);

  auto dycMov = [](const std::shared_ptr<nasm::Inst> &inst)
      -> std::shared_ptr<nasm::Mov> {
    auto mov = nasm::dyc<nasm::Mov>(inst);
    if (!mov || !nasm::dyc<nasm::Register>(mov->getOperand()) ||
        !nasm::dyc<nasm::Register>(mov->getDest()))
      return nullptr;
    return mov;
  };

  for (auto &kv : cfg.getNodes()) {
    auto &bbIdent = kv.first;
    auto &bb = kv.second;
    auto live = liveOut.at(bbIdent);
    auto rbeg = std::make_reverse_iterator(bb.getLines().second);
    auto rend = std::make_reverse_iterator(bb.getLines().first);
    for (auto riter = rbeg; riter != rend; ++riter) {
      auto inst = riter->inst;
      if (!inst)
        continue;
      auto defs = nasm::getDefinedRegs(inst);
      auto uses = nasm::getUsedRegs(inst);

      if (auto mov = dycMov(inst)) {
        subSet(live, uses);
        updateAssociatedMove(mov);
        pushWorklist(mov);
      }

      unionSet(live, defs);
      for (auto &d : defs) {
        for (auto &l : live)
          addEdge(l, d);
      }
      subSet(live, defs);
      unionSet(live, uses);
    }
  }
}